

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_context.hpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::context::context(context *this,not_null<pstore::database_*> db_)

{
  (this->db).ptr_ = db_.ptr_;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack).c.
  super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                       *)&this->stack,0);
  (this->patches).
  super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->patches;
  (this->patches).
  super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->patches;
  (this->patches).
  super__List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

explicit context (gsl::not_null<database *> const db_) noexcept
                        : db{db_} {}